

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O1

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::Catalog::CreateTable
          (Catalog *this,ClientContext *context,
          unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
          *info)

{
  CatalogTransaction transaction;
  Binder *info_00;
  type info_01;
  optional_ptr<duckdb::CatalogEntry,_true> oVar1;
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  bound_info;
  shared_ptr<duckdb::Binder,_true> binder;
  undefined1 local_68 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  CatalogTransaction local_48;
  
  Binder::CreateBinder
            ((Binder *)(local_68 + 0x10),context,(optional_ptr<duckdb::Binder,_true>)0x0,
             REGULAR_BINDER);
  info_00 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)(local_68 + 0x10));
  local_68._8_8_ =
       (info->
       super_unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CreateTableInfo_*,_std::default_delete<duckdb::CreateTableInfo>_>
       .super__Head_base<0UL,_duckdb::CreateTableInfo_*,_false>._M_head_impl;
  (info->super_unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>_>).
  _M_t.super___uniq_ptr_impl<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateTableInfo_*,_std::default_delete<duckdb::CreateTableInfo>_>.
  super__Head_base<0UL,_duckdb::CreateTableInfo_*,_false>._M_head_impl = (CreateTableInfo *)0x0;
  Binder::BindCreateTableInfo
            ((Binder *)local_68,
             (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
             info_00);
  if ((CreateTableInfo *)local_68._8_8_ != (CreateTableInfo *)0x0) {
    (**(code **)((long)(((CreateInfo *)local_68._8_8_)->super_ParseInfo)._vptr_ParseInfo + 8))();
  }
  local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  info_01 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
            ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                         *)local_68);
  CatalogTransaction::CatalogTransaction(&local_48,this,context);
  transaction.context.ptr = local_48.context.ptr;
  transaction.db.ptr = local_48.db.ptr;
  transaction.transaction.ptr = local_48.transaction.ptr;
  transaction.transaction_id = local_48.transaction_id;
  transaction.start_time = local_48.start_time;
  oVar1 = CreateTable(this,transaction,info_01);
  if ((__uniq_ptr_data<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true,_true>
       )local_68._0_8_ !=
      (tuple<duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>)0x0
     ) {
    ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
              ((default_delete<duckdb::BoundCreateTableInfo> *)local_68,
               (BoundCreateTableInfo *)local_68._0_8_);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return (optional_ptr<duckdb::CatalogEntry,_true>)oVar1.ptr;
}

Assistant:

optional_ptr<CatalogEntry> Catalog::CreateTable(ClientContext &context, unique_ptr<CreateTableInfo> info) {
	auto binder = Binder::CreateBinder(context);
	auto bound_info = binder->BindCreateTableInfo(std::move(info));
	return CreateTable(context, *bound_info);
}